

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

pair<unsigned_char,_unsigned_char> __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
::find_position<int>
          (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
           *this,int *key)

{
  int *piVar1;
  size_type sVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  const_reference piVar6;
  byte bVar7;
  ushort uVar8;
  byte bVar9;
  char cVar10;
  ushort uVar11;
  byte bVar12;
  
  sVar2 = (this->table).settings.table_size;
  bVar12 = (byte)*key;
  piVar1 = &(this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.super_Hasher
            .num_hashes_;
  *piVar1 = *piVar1 + 1;
  bVar7 = 0xff;
  cVar10 = '\x01';
  do {
    bVar12 = bVar12 & sVar2 - 1;
    uVar11 = (ushort)bVar12;
    bVar9 = bVar12 + (char)(bVar12 / 0x30) * -0x30;
    if (((this->table).groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>,_unsigned_char,_(unsigned_char)__xff_>_>
         ._M_impl.super__Vector_impl_data._M_start[bVar12 / 0x30].bitmap[bVar9 >> 3] >> (bVar9 & 7)
        & 1) == 0) {
      if (bVar7 == 0xff) {
        bVar7 = bVar12;
      }
      uVar8 = (ushort)bVar7 << 8;
      uVar11 = 0xff;
LAB_00a353a3:
      return (pair<unsigned_char,_unsigned_char>)(uVar11 | uVar8);
    }
    bVar5 = test_deleted(this,bVar12);
    if (bVar5) {
      if (bVar7 == 0xff) {
        bVar7 = bVar12;
      }
    }
    else {
      piVar6 = sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
               ::unsafe_get(&this->table,bVar12);
      iVar3 = *key;
      iVar4 = *piVar6;
      piVar1 = &(this->key_info).super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
      if (iVar3 == iVar4) {
        uVar8 = 0xff00;
        goto LAB_00a353a3;
      }
    }
    bVar12 = bVar12 + cVar10;
    cVar10 = cVar10 + '\x01';
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }